

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonEachCursorReset(JsonEachCursor *p)

{
  sqlite3_free(p->zJson);
  sqlite3_free(p->zRoot);
  sqlite3_free((p->sParse).aNode);
  (p->sParse).nNode = 0;
  (p->sParse).nAlloc = 0;
  (p->sParse).aNode = (JsonNode *)0x0;
  sqlite3_free((p->sParse).aUp);
  (p->sParse).aUp = (u32 *)0x0;
  p->iRowid = 0;
  p->i = 0;
  p->iEnd = 0;
  p->eType = '\0';
  p->zJson = (char *)0x0;
  p->zRoot = (char *)0x0;
  return;
}

Assistant:

static void jsonEachCursorReset(JsonEachCursor *p){
  sqlite3_free(p->zJson);
  sqlite3_free(p->zRoot);
  jsonParseReset(&p->sParse);
  p->iRowid = 0;
  p->i = 0;
  p->iEnd = 0;
  p->eType = 0;
  p->zJson = 0;
  p->zRoot = 0;
}